

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Matcher<const_google::protobuf::FileDescriptorProto_&> * __thiscall
testing::internal::
MatcherBaseImpl<upb_test::EqualsProtoTreatNansAsEqualMatcherP<google::protobuf::FileDescriptorProto>>
::Apply<google::protobuf::FileDescriptorProto_const&,0ul>
          (void *__return_storage_ptr__,tuple<google::protobuf::FileDescriptorProto> *this)

{
  gmock_Impl<const_google::protobuf::FileDescriptorProto_&> *this_00;
  __tuple_element_t<0UL,_tuple<FileDescriptorProto>_> *from;
  FileDescriptorProto local_118;
  tuple<google::protobuf::FileDescriptorProto> *local_20;
  MatcherBaseImpl<upb_test::EqualsProtoTreatNansAsEqualMatcherP<google::protobuf::FileDescriptorProto>_>
  *this_local;
  void *pvStack_10;
  index_sequence<0UL> param_1_local;
  
  local_20 = this;
  pvStack_10 = __return_storage_ptr__;
  this_00 = (gmock_Impl<const_google::protobuf::FileDescriptorProto_&> *)operator_new(0x100);
  from = std::get<0ul,google::protobuf::FileDescriptorProto>(this);
  google::protobuf::FileDescriptorProto::FileDescriptorProto(&local_118,from);
  upb_test::EqualsProtoTreatNansAsEqualMatcherP<google::protobuf::FileDescriptorProto>::
  gmock_Impl<const_google::protobuf::FileDescriptorProto_&>::gmock_Impl(this_00,&local_118);
  Matcher<const_google::protobuf::FileDescriptorProto_&>::Matcher
            ((Matcher<const_google::protobuf::FileDescriptorProto_&> *)__return_storage_ptr__,
             (MatcherInterface<const_google::protobuf::FileDescriptorProto_&> *)this_00);
  google::protobuf::FileDescriptorProto::~FileDescriptorProto(&local_118);
  return (Matcher<const_google::protobuf::FileDescriptorProto_&> *)__return_storage_ptr__;
}

Assistant:

::testing::Matcher<F> Apply(std::index_sequence<tuple_ids...>) const {
    return ::testing::Matcher<F>(
        new typename Derived<Ts...>::template gmock_Impl<F>(
            std::get<tuple_ids>(params_)...));
  }